

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QString * __thiscall QDir::dirName(QString *__return_storage_ptr__,QDir *this)

{
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  
  pQVar1 = (this->d_ptr).d.ptr;
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (pQVar1->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
      (QAbstractFileEngine *)0x0) {
    QFileSystemEntry::fileName(__return_storage_ptr__,&pQVar1->dirEntry);
  }
  else {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl +
                200))(__return_storage_ptr__,
                      _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,1);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDir::dirName() const
{
    Q_D(const QDir);
    if (!d_ptr->fileEngine)
        return d->dirEntry.fileName();
    return d->fileEngine->fileName(QAbstractFileEngine::BaseName);
}